

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex frameIndex,MatrixView<double> *outJacobianPattern)

{
  MatrixStorageOrdering MVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char cVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  pointer peVar9;
  long *plVar10;
  size_t c;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  element_type *peVar15;
  pointer peVar16;
  long lVar17;
  index_type iVar18;
  long lVar19;
  Index i;
  ulong uVar20;
  pointer peVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ulong uVar29;
  int iVar30;
  SpatialMotionVector jointMotionSubspace;
  type tmp;
  Matrix6x6 genericAdjointTransform;
  long local_208;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_1a0 [3];
  element_type aeStack_188 [7];
  double local_150 [5];
  element_type aeStack_128 [31];
  
  cVar5 = iDynTree::Model::isValidFrameIndex((long)&this->pimpl->m_robot_model);
  if (cVar5 == '\0') {
    iDynTree::reportError("KinDynComputations","getFrameJacobian","Frame index out of bounds");
    bVar25 = false;
  }
  else {
    if (outJacobianPattern->m_rows == 6) {
      lVar24 = outJacobianPattern->m_cols;
      lVar8 = iDynTree::Model::getNrOfDOFs();
      bVar25 = lVar24 == lVar8 + 6;
    }
    else {
      bVar25 = false;
    }
    if (bVar25) {
      local_208 = iDynTree::Model::getFrameLink((long)&this->pimpl->m_robot_model);
      lVar24 = 0;
      memset(local_150,0,0x120);
      auVar4 = _DAT_00116010;
      auVar3 = _DAT_00116000;
      do {
        *(undefined8 *)((long)local_150 + lVar24) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_150 + lVar24 + 8) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_150 + lVar24 + 0x10) = 0x3ff0000000000000;
        lVar24 = lVar24 + 0x30;
      } while (lVar24 != 0x90);
      lVar24 = 0;
      do {
        *(undefined8 *)((long)local_150 + lVar24 + 0x18) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_150 + lVar24 + 0x20) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_150 + lVar24 + 0x28) = 0x3ff0000000000000;
        lVar24 = lVar24 + 0x30;
      } while (lVar24 != 0x90);
      lVar24 = 0xa8;
      do {
        *(undefined8 *)((long)local_150 + lVar24) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_150 + lVar24 + 8) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_150 + lVar24 + 0x10) = 0x3ff0000000000000;
        lVar24 = lVar24 + 0x30;
      } while (lVar24 != 0x138);
      MVar1 = outJacobianPattern->m_storageOrder;
      peVar9 = outJacobianPattern->m_storage;
      lVar24 = outJacobianPattern->m_rows;
      lVar8 = 1;
      lVar23 = 1;
      if (MVar1 == ColumnMajor) {
        lVar23 = lVar24;
      }
      lVar17 = outJacobianPattern->m_cols;
      lVar19 = lVar17;
      if (MVar1 == ColumnMajor) {
        lVar19 = 1;
      }
      if (0 < lVar24) {
        lVar22 = lVar17 + -1;
        auVar26._8_4_ = (int)lVar22;
        auVar26._0_8_ = lVar22;
        auVar26._12_4_ = (int)((ulong)lVar22 >> 0x20);
        lVar22 = 0;
        auVar26 = auVar26 ^ _DAT_00116010;
        peVar16 = peVar9;
        do {
          uVar20 = lVar17 + 1U & 0xfffffffffffffffe;
          peVar21 = peVar16;
          auVar27 = auVar3;
          if (0 < lVar17) {
            do {
              bVar2 = auVar26._0_4_ < SUB164(auVar27 ^ auVar4,0);
              iVar6 = auVar26._4_4_;
              iVar30 = SUB164(auVar27 ^ auVar4,4);
              if ((bool)(~(iVar6 < iVar30 || iVar30 == iVar6 && bVar2) & 1)) {
                *peVar21 = 0.0;
              }
              if (iVar6 >= iVar30 && (iVar30 != iVar6 || !bVar2)) {
                peVar21[lVar23] = 0.0;
              }
              auVar28._0_8_ = auVar27._0_8_ + 2;
              auVar28._8_8_ = auVar27._8_8_ + 2;
              uVar20 = uVar20 - 2;
              peVar21 = peVar21 + lVar23 * 2;
              auVar27 = auVar28;
            } while (uVar20 != 0);
          }
          lVar22 = lVar22 + 1;
          peVar16 = peVar16 + lVar19;
        } while (lVar22 != lVar24);
      }
      lVar24 = outJacobianPattern->m_rows;
      if (MVar1 != ColumnMajor) {
        lVar8 = outJacobianPattern->m_cols;
      }
      if (0 < lVar24) {
        lVar23 = 1;
        if (MVar1 == ColumnMajor) {
          lVar23 = lVar24;
        }
        peVar15 = local_150 + 5;
        do {
          *peVar9 = peVar15[-5];
          peVar9[lVar23] = peVar15[-4];
          peVar9[lVar23 * 2] = peVar15[-3];
          peVar9[lVar23 * 3] = peVar15[-2];
          peVar9[lVar23 * 4] = peVar15[-1];
          peVar9[lVar23 * 5] = *peVar15;
          peVar15 = peVar15 + 6;
          peVar9 = peVar9 + lVar8;
          lVar24 = lVar24 + -1;
        } while (lVar24 != 0);
      }
      iDynTree::Traversal::getBaseLink();
      lVar24 = iDynTree::Link::getIndex();
      if (local_208 != lVar24) {
        do {
          iDynTree::Traversal::getParentLinkFromLinkIndex((long)&this->pimpl->m_traversal);
          lVar24 = iDynTree::Link::getIndex();
          plVar10 = (long *)iDynTree::Traversal::getParentJointFromLinkIndex
                                      ((long)&this->pimpl->m_traversal);
          lVar8 = (**(code **)(*plVar10 + 0xc0))(plVar10);
          iVar6 = (**(code **)(*plVar10 + 0x20))(plVar10);
          if (iVar6 != 0) {
            lVar23 = lVar8 * 8 + 0x30;
            uVar20 = 0;
            do {
              pdVar13 = &local_1b8;
              (**(code **)(*plVar10 + 0x60))(pdVar13,plVar10,uVar20 & 0xffffffff,local_208,lVar24);
              uVar11 = 0;
              uVar29 = (ulong)DAT_00116040;
              do {
                pdVar12 = local_1a0 + ((int)uVar11 - 3);
                if (uVar11 < 3) {
                  pdVar12 = pdVar13;
                }
                *pdVar12 = (double)(~-(ulong)((double)((ulong)*pdVar12 & uVar29) < DEFAULT_TOL) &
                                   0x3ff0000000000000);
                uVar11 = uVar11 + 1;
                pdVar13 = pdVar13 + 1;
              } while (uVar11 != 6);
              MVar1 = outJacobianPattern->m_storageOrder;
              peVar9 = outJacobianPattern->m_storage;
              lVar17 = outJacobianPattern->m_rows;
              lVar19 = 1;
              if (MVar1 == ColumnMajor) {
                lVar19 = lVar17;
              }
              iVar18 = outJacobianPattern->m_cols;
              pdVar13 = local_150 + 4;
              lVar22 = 0;
              do {
                local_1a0[lVar22 + 3] =
                     pdVar13[1] * local_1a0[2] + pdVar13[-1] * local_1a0[0] +
                     pdVar13[-3] * dStack_1b0 +
                     *pdVar13 * local_1a0[1] + pdVar13[-2] * local_1a8 + pdVar13[-4] * local_1b8;
                lVar22 = lVar22 + 1;
                pdVar13 = pdVar13 + 6;
              } while (lVar22 != 6);
              if (MVar1 == ColumnMajor) {
                iVar18 = 1;
              }
              if (0 < lVar17) {
                peVar16 = (pointer)(lVar19 * lVar23 + (long)peVar9);
                lVar19 = 0;
                do {
                  *peVar16 = local_1a0[lVar19 + 3];
                  lVar19 = lVar19 + 1;
                  peVar16 = peVar16 + iVar18;
                } while (lVar17 != lVar19);
              }
              uVar11 = outJacobianPattern->m_rows;
              if (uVar11 != 0) {
                uVar14 = 0;
                do {
                  iVar18 = 1;
                  if (MVar1 != ColumnMajor) {
                    iVar18 = outJacobianPattern->m_cols;
                    uVar11 = 1;
                  }
                  lVar17 = uVar11 * (lVar8 + 6 + uVar20);
                  peVar9[lVar17 + iVar18 * uVar14] =
                       (element_type)
                       (~-(ulong)((double)((ulong)peVar9[lVar17 + iVar18 * uVar14] & uVar29) <
                                 DEFAULT_TOL) & 0x3ff0000000000000);
                  uVar14 = uVar14 + 1;
                  uVar11 = outJacobianPattern->m_rows;
                } while (uVar14 < uVar11);
              }
              uVar20 = uVar20 + 1;
              uVar7 = (**(code **)(*plVar10 + 0x20))(plVar10);
              lVar23 = lVar23 + 8;
            } while (uVar20 < uVar7);
          }
          iDynTree::Traversal::getBaseLink();
          lVar8 = iDynTree::Link::getIndex();
          local_208 = lVar24;
        } while (lVar24 != lVar8);
      }
    }
    else {
      iDynTree::reportError
                ("KinDynComputations","getFrameFreeJacobianSparsityPattern",
                 "Wrong size in input outJacobianPattern");
    }
  }
  return bVar25;
}

Assistant:

bool KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern(const FrameIndex frameIndex,
                                                                         MatrixView<double> outJacobianPattern) const
    {
        if (!pimpl->m_robot_model.isValidFrameIndex(frameIndex))
        {
            reportError("KinDynComputations","getFrameJacobian","Frame index out of bounds");
            return false;
        }

        bool ok = (outJacobianPattern.rows() == 6)
            && (outJacobianPattern.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

        if( !ok )
        {
            reportError("KinDynComputations",
                        "getFrameFreeJacobianSparsityPattern",
                        "Wrong size in input outJacobianPattern");
            return false;
        }

        // Get the link to which the frame is attached
        LinkIndex jacobLink = pimpl->m_robot_model.getFrameLink(frameIndex);

        Matrix6x6 genericAdjointTransform;
        genericAdjointTransform.zero();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).topLeftCorner(3, 3).setOnes();
        // Set 1 to p \times R (top right)
        iDynTree::toEigen(genericAdjointTransform).topRightCorner(3, 3).setOnes();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).bottomRightCorner(3, 3).setOnes();

        // We zero the jacobian
        toEigen(outJacobianPattern).setZero();

        // Compute base part
        toEigen(outJacobianPattern).leftCols<6>() = toEigen(genericAdjointTransform);

        // Compute joint part
        // We iterate from the link up in the traveral until we reach the base
        LinkIndex visitedLinkIdx = jacobLink;

        while (visitedLinkIdx != pimpl->m_traversal.getBaseLink()->getIndex())
        {
            LinkIndex parentLinkIdx = pimpl->m_traversal.getParentLinkFromLinkIndex(visitedLinkIdx)->getIndex();
            IJointConstPtr joint = pimpl->m_traversal.getParentJointFromLinkIndex(visitedLinkIdx);

            size_t dofOffset = joint->getDOFsOffset();
            for (unsigned i = 0; i < joint->getNrOfDOFs(); ++i)
            {
                SpatialMotionVector jointMotionSubspace = joint->getMotionSubspaceVector(i, visitedLinkIdx, parentLinkIdx);
                // 1 or 0 in vector
                for (size_t c = 0; c < jointMotionSubspace.size(); ++c) {
                    jointMotionSubspace(c) = std::abs(jointMotionSubspace(c)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
                toEigen(outJacobianPattern).col(6 + dofOffset + i) = toEigen(genericAdjointTransform) * toEigen(jointMotionSubspace);
                //have only 0 and 1 => divide component wise the column by itself
                for (size_t r = 0; r < toEigen(outJacobianPattern).col(6 + dofOffset + i).size(); ++r) {
                    toEigen(outJacobianPattern).col(6 + dofOffset + i).coeffRef(r) = std::abs(toEigen(outJacobianPattern).col(6 + dofOffset + i).coeffRef(r)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
            }

            visitedLinkIdx = parentLinkIdx;
        }

        return true;
    }